

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void (anonymous_namespace)::
     randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *container)

{
  anon_class_16_2_625a9a03 __gen;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  result_type rVar1;
  default_random_engine eng;
  random_device rnd;
  uniform_int_distribution<unsigned_int> dist;
  uint in_stack_ffffffffffffec18;
  uint in_stack_ffffffffffffec1c;
  uniform_int_distribution<unsigned_int> *in_stack_ffffffffffffec20;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *this;
  undefined4 in_stack_ffffffffffffec28;
  random_device *in_stack_ffffffffffffec60;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_1398 [625];
  undefined1 local_10 [16];
  
  std::numeric_limits<unsigned_char>::max();
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            (in_stack_ffffffffffffec20,in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18);
  this = local_1398;
  std::random_device::random_device(in_stack_ffffffffffffec60);
  rVar1 = std::random_device::operator()((random_device *)0x1c61df);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(this,CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18));
  __last._M_current._4_4_ = rVar1;
  __last._M_current._0_4_ = in_stack_ffffffffffffec28;
  __gen.dist._4_4_ = in_stack_ffffffffffffec1c;
  __gen.dist._0_4_ = in_stack_ffffffffffffec18;
  __gen.eng = this;
  std::
  generate<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,(anonymous_namespace)::randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>(std::vector<unsigned_char,std::allocator<unsigned_char>>&)::_lambda()_1_>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_10,__last,__gen);
  std::random_device::~random_device((random_device *)0x1c6259);
  return;
}

Assistant:

void randomize_container(C& container) {
    std::uniform_int_distribution<unsigned int> dist{
        0, std::numeric_limits<typename C::value_type>::max()};
    std::random_device rnd;
    std::default_random_engine eng(rnd());
    std::generate(container.begin(), container.end(), [&dist, &eng] { return dist(eng); });
  }